

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

void __thiscall CodeGen::generate(CodeGen *this,ValidSchema *schema)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  pointer pPVar5;
  pointer __rhs;
  string h;
  string sn;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  emitCopyright(this);
  if ((this->guardString_)._M_string_length == 0) {
    guard_abi_cxx11_(&local_b0,this);
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,(string *)&this->guardString_);
  }
  poVar3 = std::operator<<(this->os_,"#ifndef ");
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(this->os_,"#define ");
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  std::operator<<(poVar3,"\n\n\n");
  poVar3 = std::operator<<(this->os_,"#include <sstream>\n");
  poVar3 = std::operator<<(poVar3,"#include \"boost/any.hpp\"\n");
  poVar3 = std::operator<<(poVar3,"#include \"");
  psVar1 = &this->includePrefix_;
  poVar3 = std::operator<<(poVar3,(string *)psVar1);
  poVar3 = std::operator<<(poVar3,"Specific.hh\"\n");
  poVar3 = std::operator<<(poVar3,"#include \"");
  poVar3 = std::operator<<(poVar3,(string *)psVar1);
  poVar3 = std::operator<<(poVar3,"Encoder.hh\"\n");
  poVar3 = std::operator<<(poVar3,"#include \"");
  poVar3 = std::operator<<(poVar3,(string *)psVar1);
  poVar3 = std::operator<<(poVar3,"Decoder.hh\"\n");
  std::operator<<(poVar3,"\n");
  if ((this->ns_)._M_string_length != 0) {
    poVar3 = std::operator<<(this->os_,"namespace ");
    poVar3 = std::operator<<(poVar3,(string *)&this->ns_);
    std::operator<<(poVar3," {\n");
    this->inNamespace_ = true;
  }
  generateType_abi_cxx11_(&local_90,this,&schema->root_);
  std::__cxx11::string::~string((string *)&local_90);
  for (__rhs = (this->pendingGettersAndSetters).
               super__Vector_base<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>._M_impl
               .super__Vector_impl_data._M_start;
      __rhs != (this->pendingGettersAndSetters).
               super__Vector_base<PendingSetterGetter,_std::allocator<PendingSetterGetter>_>._M_impl
               .super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    poVar3 = this->os_;
    std::operator+(&local_70," ",&__rhs->structName);
    std::operator+(&local_50,&local_70,"::");
    std::__cxx11::string::~string((string *)&local_70);
    std::operator<<(poVar3,"inline\n");
    poVar4 = std::operator<<(poVar3,(string *)&__rhs->type);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,"get_");
    poVar4 = std::operator<<(poVar4,(string *)&__rhs->name);
    poVar4 = std::operator<<(poVar4,"() const {\n");
    poVar4 = std::operator<<(poVar4,"    if (idx_ != ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,") {\n");
    poVar4 = std::operator<<(poVar4,"        throw avro::Exception(\"Invalid type for ");
    poVar4 = std::operator<<(poVar4,"union\");\n");
    poVar4 = std::operator<<(poVar4,"    }\n");
    poVar4 = std::operator<<(poVar4,"    return boost::any_cast<");
    poVar4 = std::operator<<(poVar4,(string *)&__rhs->type);
    poVar4 = std::operator<<(poVar4," >(value_);\n");
    std::operator<<(poVar4,"}\n\n");
    poVar3 = std::operator<<(poVar3,"inline\n");
    poVar3 = std::operator<<(poVar3,"void");
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"set_");
    poVar3 = std::operator<<(poVar3,(string *)&__rhs->name);
    poVar3 = std::operator<<(poVar3,"(const ");
    poVar3 = std::operator<<(poVar3,(string *)&__rhs->type);
    poVar3 = std::operator<<(poVar3,"& v) {\n");
    poVar3 = std::operator<<(poVar3,"    idx_ = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"    value_ = v;\n");
    std::operator<<(poVar3,"}\n\n");
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (pPVar5 = (this->pendingConstructors).
                super__Vector_base<PendingConstructor,_std::allocator<PendingConstructor>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar5 != (this->pendingConstructors).
                super__Vector_base<PendingConstructor,_std::allocator<PendingConstructor>_>._M_impl.
                super__Vector_impl_data._M_finish; pPVar5 = pPVar5 + 1) {
    poVar3 = this->os_;
    bVar2 = pPVar5->initMember;
    poVar4 = std::operator<<(poVar3,"inline ");
    poVar4 = std::operator<<(poVar4,(string *)pPVar5);
    poVar4 = std::operator<<(poVar4,"::");
    poVar4 = std::operator<<(poVar4,(string *)pPVar5);
    std::operator<<(poVar4,"() : idx_(0)");
    if (bVar2 != false) {
      poVar4 = std::operator<<(poVar3,", value_(");
      poVar4 = std::operator<<(poVar4,(string *)&pPVar5->memberName);
      std::operator<<(poVar4,"())");
    }
    std::operator<<(poVar3," { }\n");
  }
  if ((this->ns_)._M_string_length != 0) {
    this->inNamespace_ = false;
    std::operator<<(this->os_,"}\n");
  }
  std::operator<<(this->os_,"namespace avro {\n");
  this->unionNumber_ = 0;
  generateTraits(this,&schema->root_);
  std::operator<<(this->os_,"}\n");
  std::operator<<(this->os_,"#endif\n");
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void CodeGen::generate(const ValidSchema& schema)
{
    emitCopyright();

    string h = guardString_.empty() ? guard() : guardString_;

    os_ << "#ifndef " << h << "\n";
    os_ << "#define " << h << "\n\n\n";

    os_ << "#include <sstream>\n"
        << "#include \"boost/any.hpp\"\n"
        << "#include \"" << includePrefix_ << "Specific.hh\"\n"
        << "#include \"" << includePrefix_ << "Encoder.hh\"\n"
        << "#include \"" << includePrefix_ << "Decoder.hh\"\n"
        << "\n";

    if (! ns_.empty()) {
        os_ << "namespace " << ns_ << " {\n";
        inNamespace_ = true;
    }

    const NodePtr& root = schema.root();
    generateType(root);

    for (vector<PendingSetterGetter>::const_iterator it =
        pendingGettersAndSetters.begin();
        it != pendingGettersAndSetters.end(); ++it) {
        generateGetterAndSetter(os_, it->structName, it->type, it->name,
            it->idx);
    }

    for (vector<PendingConstructor>::const_iterator it =
        pendingConstructors.begin();
        it != pendingConstructors.end(); ++it) {
        generateConstructor(os_, it->structName,
            it->initMember, it->memberName);
    }

    if (! ns_.empty()) {
        inNamespace_ = false;
        os_ << "}\n";
    }

    os_ << "namespace avro {\n";

    unionNumber_ = 0;

    generateTraits(root);

    os_ << "}\n";

    os_ << "#endif\n";
    os_.flush();

}